

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_buffered_data.cpp
# Opt level: O3

void __thiscall
duckdb::BatchedBufferedData::BatchedBufferedData
          (BatchedBufferedData *this,weak_ptr<duckdb::ClientContext,_true> *context)

{
  _Atomic_word *p_Var1;
  _Rb_tree_header *p_Var2;
  idx_t iVar3;
  double dVar4;
  int iVar5;
  ulong uVar6;
  double dVar7;
  weak_ptr<duckdb::ClientContext,_true> local_38 [2];
  
  local_38[0].internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (context->internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_38[0].internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (context->internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (context->internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (context->internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  BufferedData::BufferedData(&this->super_BufferedData,BATCHED,local_38);
  if (local_38[0].internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_38[0].internal.
                 super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = (local_38[0].internal.
               super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              )->_M_weak_count;
      (local_38[0].internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*(local_38[0].internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  (this->super_BufferedData)._vptr_BufferedData = (_func_int **)&PTR__BatchedBufferedData_024634b8;
  p_Var2 = &(this->buffer)._M_t._M_impl.super__Rb_tree_header;
  (this->buffer)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->buffer)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->buffer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->buffer)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->buffer)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->buffer_byte_count).super___atomic_base<unsigned_long>._M_i = 0;
  (this->read_queue).
  super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->read_queue).
  super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->read_queue).
  super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->read_queue).
  super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->read_queue).
  super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->read_queue).
  super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->read_queue).
  super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->read_queue).
  super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->read_queue).
  super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->read_queue).
  super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ::std::
  _Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
  ::_M_initialize_map(&(this->read_queue).
                       super__Deque_base<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
                      ,0);
  (this->read_queue_byte_count).super___atomic_base<unsigned_long>._M_i = 0;
  p_Var2 = &(this->blocked_sinks)._M_t._M_impl.super__Rb_tree_header;
  (this->blocked_sinks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->blocked_sinks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->blocked_sinks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->blocked_sinks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->blocked_sinks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->min_batch = 0;
  this->lowest_moved_batch = 0;
  iVar3 = (this->super_BufferedData).total_buffer_size;
  dVar7 = ((double)CONCAT44(0x45300000,(int)(iVar3 >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)iVar3) - 4503599627370496.0);
  dVar4 = dVar7 * 0.6;
  uVar6 = (ulong)dVar4;
  this->read_queue_capacity = (long)(dVar4 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6;
  dVar7 = dVar7 * 0.4;
  uVar6 = (ulong)dVar7;
  this->buffer_capacity = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6;
  return;
}

Assistant:

BatchedBufferedData::BatchedBufferedData(weak_ptr<ClientContext> context)
    : BufferedData(BufferedData::Type::BATCHED, std::move(context)), buffer_byte_count(0), read_queue_byte_count(0),
      min_batch(0) {
	read_queue_capacity = (idx_t)(static_cast<double>(total_buffer_size) * 0.6);
	buffer_capacity = (idx_t)(static_cast<double>(total_buffer_size) * 0.4);
}